

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O1

void __thiscall o3dgc::Arithmetic_Codec::put_bit(Arithmetic_Codec *this,uint bit)

{
  uint *puVar1;
  uchar *puVar2;
  uint uVar3;
  uchar uVar4;
  uint uVar5;
  uchar *puVar6;
  
  uVar5 = this->length >> 1;
  this->length = uVar5;
  if (bit != 0) {
    puVar1 = &this->base;
    uVar3 = *puVar1;
    *puVar1 = *puVar1 + uVar5;
    if (CARRY4(uVar3,uVar5)) {
      puVar6 = this->ac_pointer;
      while( true ) {
        puVar2 = puVar6 + -1;
        puVar6 = puVar6 + -1;
        if (*puVar2 != 0xff) break;
        *puVar6 = '\0';
      }
      *puVar6 = *puVar2 + '\x01';
    }
  }
  uVar5 = this->length;
  while (uVar5 < 0x1000000) {
    uVar4 = *(uchar *)((long)&this->base + 3);
    puVar6 = this->ac_pointer;
    this->ac_pointer = puVar6 + 1;
    *puVar6 = uVar4;
    this->base = this->base << 8;
    uVar5 = this->length << 8;
    this->length = uVar5;
  }
  return;
}

Assistant:

void Arithmetic_Codec::put_bit(unsigned bit)
    {
    #ifdef _DEBUG
      if (mode != 1) AC_Error("encoder not initialized");
    #endif

      length >>= 1;                                              // halve interval
      if (bit) {
        unsigned init_base = base;
        base += length;                                               // move base
        if (init_base > base) propagate_carry();               // overflow = carry
      }

      if (length < AC__MinLength) renorm_enc_interval();        // renormalization
    }